

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O1

add_torrent_params * __thiscall
libtorrent::parse_magnet_uri
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,string_view uri)

{
  string_view uri_00;
  error_code ec;
  error_code local_30;
  
  local_30.val_ = 0;
  local_30.failed_ = false;
  local_30.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  uri_00._M_str = (char *)uri._M_len;
  uri_00._M_len = (size_t)this;
  parse_magnet_uri(uri_00,__return_storage_ptr__,&local_30);
  if (local_30.failed_ != true) {
    return __return_storage_ptr__;
  }
  aux::throw_ex<boost::system::system_error,boost::system::error_code&>(&local_30);
}

Assistant:

add_torrent_params parse_magnet_uri(string_view uri)
	{
		error_code ec;
		add_torrent_params ret;
		parse_magnet_uri(uri, ret, ec);
		if (ec) aux::throw_ex<system_error>(ec);
		return ret;
	}